

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_CREATION_DATA_Unmarshal(TPMS_CREATION_DATA *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_CREATION_DATA *target_local;
  
  target_local._4_4_ = TPML_PCR_SELECTION_Unmarshal(&target->pcrSelect,buffer,size);
  if ((((target_local._4_4_ == 0) &&
       (target_local._4_4_ = TPM2B_DIGEST_Unmarshal(&target->pcrDigest,buffer,size),
       target_local._4_4_ == 0)) &&
      (target_local._4_4_ = UINT8_Unmarshal((UINT8 *)&target->locality,buffer,size),
      target_local._4_4_ == 0)) &&
     (((target_local._4_4_ = UINT16_Unmarshal(&target->parentNameAlg,buffer,size),
       target_local._4_4_ == 0 &&
       (target_local._4_4_ = TPM2B_NAME_Unmarshal(&target->parentName,buffer,size),
       target_local._4_4_ == 0)) &&
      (target_local._4_4_ = TPM2B_NAME_Unmarshal(&target->parentQualifiedName,buffer,size),
      target_local._4_4_ == 0)))) {
    target_local._4_4_ = TPM2B_DATA_Unmarshal(&target->outsideInfo,buffer,size);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_CREATION_DATA_Unmarshal(TPMS_CREATION_DATA *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPML_PCR_SELECTION_Unmarshal((TPML_PCR_SELECTION *)&(target->pcrSelect), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->pcrDigest), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMA_LOCALITY_Unmarshal((TPMA_LOCALITY *)&(target->locality), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)&(target->parentNameAlg), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_NAME_Unmarshal((TPM2B_NAME *)&(target->parentName), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_NAME_Unmarshal((TPM2B_NAME *)&(target->parentQualifiedName), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DATA_Unmarshal((TPM2B_DATA *)&(target->outsideInfo), buffer, size);
    return result;
}